

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::VertexBindingBufferCase::test
          (VertexBindingBufferCase *this,ResultCollector *result)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TestLog *pTVar3;
  int iVar4;
  GLenum GVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar6;
  undefined4 extraout_var_01;
  long *plVar7;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  size_type *psVar8;
  int binding;
  int index;
  ulong uVar9;
  undefined8 uVar10;
  ScopedLogSection section;
  VertexArray otherVao_1;
  GLuint otherBuffer_1;
  CallLogWrapper gl;
  GLint reportedMaxBindings;
  ScopedLogSection section_1;
  VertexArray vao;
  VertexArray otherVao;
  Buffer buffer;
  Buffer otherBuffer;
  ScopedLogSection local_168;
  long local_160;
  TestLog local_158;
  long lStack_150;
  string local_148;
  string local_128;
  string local_108;
  ulong *local_e8;
  long local_e0;
  ulong local_d8 [2];
  CallLogWrapper local_c8;
  GLint local_ac;
  ScopedLogSection local_a8;
  code *local_a0;
  GLenum local_98;
  ObjectWrapper local_90;
  ObjectWrapper local_78;
  ObjectWrapper local_60;
  ObjectWrapper local_48;
  
  iVar4 = (*((this->super_IndexedCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext
            [3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_c8,(Functions *)CONCAT44(extraout_var,iVar4),
             ((this->super_IndexedCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
             m_log);
  iVar4 = (*((this->super_IndexedCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext
            [3])();
  pOVar6 = glu::objectTraits(OBJECTTYPE_VERTEX_ARRAY);
  glu::ObjectWrapper::ObjectWrapper(&local_90,(Functions *)CONCAT44(extraout_var_00,iVar4),pOVar6);
  iVar4 = (*((this->super_IndexedCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext
            [3])();
  pOVar6 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_60,(Functions *)CONCAT44(extraout_var_01,iVar4),pOVar6);
  local_ac = -1;
  local_c8.m_enableLog = true;
  glu::CallLogWrapper::glBindVertexArray(&local_c8,local_90.m_object);
  glu::CallLogWrapper::glGetIntegerv(&local_c8,0x82da,&local_ac);
  GVar5 = glu::CallLogWrapper::glGetError(&local_c8);
  if (GVar5 != 0) {
    local_e8 = local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Got Error ","");
    local_78.m_gl = (Functions *)glu::getErrorName;
    local_78.m_traits._0_4_ = GVar5;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_108,&local_78);
    uVar9 = 0xf;
    if (local_e8 != local_d8) {
      uVar9 = local_d8[0];
    }
    if (uVar9 < local_108._M_string_length + local_e0) {
      uVar10 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        uVar10 = local_108.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar10 < local_108._M_string_length + local_e0) goto LAB_01577131;
      plVar7 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_108,0,(char *)0x0,(ulong)local_e8);
    }
    else {
LAB_01577131:
      plVar7 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_e8,(ulong)local_108._M_dataplus._M_p);
    }
    local_168.m_log = &local_158;
    pTVar3 = (TestLog *)(plVar7 + 2);
    if ((TestLog *)*plVar7 == pTVar3) {
      local_158.m_log = pTVar3->m_log;
      lStack_150 = plVar7[3];
    }
    else {
      local_158.m_log = pTVar3->m_log;
      local_168.m_log = (TestLog *)*plVar7;
    }
    local_160 = plVar7[1];
    *plVar7 = (long)pTVar3;
    plVar7[1] = 0;
    *(undefined1 *)&pTVar3->m_log = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_168);
    psVar8 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_128.field_2._M_allocated_capacity = *psVar8;
      local_128.field_2._8_8_ = plVar7[3];
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    }
    else {
      local_128.field_2._M_allocated_capacity = *psVar8;
      local_128._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_128._M_string_length = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_128);
    psVar8 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_148.field_2._M_allocated_capacity = *psVar8;
      local_148.field_2._8_8_ = plVar7[3];
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    }
    else {
      local_148.field_2._M_allocated_capacity = *psVar8;
      local_148._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_148._M_string_length = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    tcu::ResultCollector::fail(result,&local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if (local_168.m_log != &local_158) {
      operator_delete(local_168.m_log,(ulong)((long)&(local_158.m_log)->flags + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if (local_e8 != local_d8) {
      operator_delete(local_e8,local_d8[0] + 1);
    }
  }
  iVar4 = 0x10;
  if (0x10 < local_ac) {
    iVar4 = local_ac;
  }
  pTVar3 = ((this->super_IndexedCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"initial","");
  paVar1 = &local_128.field_2;
  local_128._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"Initial values","");
  tcu::ScopedLogSection::ScopedLogSection(&local_168,pTVar3,&local_148,&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar1) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  index = 0;
  do {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (result,&local_c8,0x8f4f,index,0,(this->super_IndexedCase).m_verifier);
    index = index + 1;
  } while (iVar4 != index);
  tcu::TestLog::endSection(local_168.m_log);
  pTVar3 = ((this->super_IndexedCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  paVar2 = &local_148.field_2;
  local_148._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"vao","");
  local_128._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"VAO state","");
  tcu::ScopedLogSection::ScopedLogSection(&local_a8,pTVar3,&local_148,&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar1) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != paVar2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  iVar4 = (*((this->super_IndexedCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext
            [3])();
  pOVar6 = glu::objectTraits(OBJECTTYPE_VERTEX_ARRAY);
  glu::ObjectWrapper::ObjectWrapper(&local_78,(Functions *)CONCAT44(extraout_var_02,iVar4),pOVar6);
  iVar4 = (*((this->super_IndexedCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext
            [3])();
  pOVar6 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_48,(Functions *)CONCAT44(extraout_var_03,iVar4),pOVar6);
  glu::CallLogWrapper::glBindVertexBuffer(&local_c8,1,local_60.m_object,0,0x20);
  GVar5 = glu::CallLogWrapper::glGetError(&local_c8);
  if (GVar5 != 0) {
    local_e8 = local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Got Error ","");
    local_a0 = glu::getErrorName;
    local_98 = GVar5;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_108,&local_a0);
    uVar9 = 0xf;
    if (local_e8 != local_d8) {
      uVar9 = local_d8[0];
    }
    if (uVar9 < local_108._M_string_length + local_e0) {
      uVar10 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        uVar10 = local_108.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar10 < local_108._M_string_length + local_e0) goto LAB_0157755c;
      plVar7 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_108,0,(char *)0x0,(ulong)local_e8);
    }
    else {
LAB_0157755c:
      plVar7 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_e8,(ulong)local_108._M_dataplus._M_p);
    }
    local_168.m_log = &local_158;
    pTVar3 = (TestLog *)(plVar7 + 2);
    if ((TestLog *)*plVar7 == pTVar3) {
      local_158.m_log = pTVar3->m_log;
      lStack_150 = plVar7[3];
    }
    else {
      local_158.m_log = pTVar3->m_log;
      local_168.m_log = (TestLog *)*plVar7;
    }
    local_160 = plVar7[1];
    *plVar7 = (long)pTVar3;
    plVar7[1] = 0;
    *(undefined1 *)&pTVar3->m_log = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_168);
    psVar8 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_128.field_2._M_allocated_capacity = *psVar8;
      local_128.field_2._8_8_ = plVar7[3];
      local_128._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_128.field_2._M_allocated_capacity = *psVar8;
      local_128._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_128._M_string_length = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_128);
    psVar8 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_148.field_2._M_allocated_capacity = *psVar8;
      local_148.field_2._8_8_ = plVar7[3];
      local_148._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_148.field_2._M_allocated_capacity = *psVar8;
      local_148._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_148._M_string_length = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    tcu::ResultCollector::fail(result,&local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != paVar2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != paVar1) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if (local_168.m_log != &local_158) {
      operator_delete(local_168.m_log,(ulong)((long)&(local_158.m_log)->flags + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if (local_e8 != local_d8) {
      operator_delete(local_e8,local_d8[0] + 1);
    }
  }
  glu::CallLogWrapper::glBindVertexArray(&local_c8,local_78.m_object);
  GVar5 = glu::CallLogWrapper::glGetError(&local_c8);
  if (GVar5 != 0) {
    local_e8 = local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Got Error ","");
    local_a0 = glu::getErrorName;
    local_98 = GVar5;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_108,&local_a0);
    uVar9 = 0xf;
    if (local_e8 != local_d8) {
      uVar9 = local_d8[0];
    }
    if (uVar9 < local_108._M_string_length + local_e0) {
      uVar10 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        uVar10 = local_108.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar10 < local_108._M_string_length + local_e0) goto LAB_015777b1;
      plVar7 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_108,0,(char *)0x0,(ulong)local_e8);
    }
    else {
LAB_015777b1:
      plVar7 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_e8,(ulong)local_108._M_dataplus._M_p);
    }
    local_168.m_log = &local_158;
    pTVar3 = (TestLog *)(plVar7 + 2);
    if ((TestLog *)*plVar7 == pTVar3) {
      local_158.m_log = pTVar3->m_log;
      lStack_150 = plVar7[3];
    }
    else {
      local_158.m_log = pTVar3->m_log;
      local_168.m_log = (TestLog *)*plVar7;
    }
    local_160 = plVar7[1];
    *plVar7 = (long)pTVar3;
    plVar7[1] = 0;
    *(undefined1 *)&pTVar3->m_log = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_168);
    psVar8 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_128.field_2._M_allocated_capacity = *psVar8;
      local_128.field_2._8_8_ = plVar7[3];
      local_128._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_128.field_2._M_allocated_capacity = *psVar8;
      local_128._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_128._M_string_length = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_128);
    psVar8 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_148.field_2._M_allocated_capacity = *psVar8;
      local_148.field_2._8_8_ = plVar7[3];
      local_148._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_148.field_2._M_allocated_capacity = *psVar8;
      local_148._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_148._M_string_length = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    tcu::ResultCollector::fail(result,&local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != paVar2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != paVar1) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if (local_168.m_log != &local_158) {
      operator_delete(local_168.m_log,(ulong)((long)&(local_158.m_log)->flags + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if (local_e8 != local_d8) {
      operator_delete(local_e8,local_d8[0] + 1);
    }
  }
  glu::CallLogWrapper::glBindVertexBuffer(&local_c8,1,local_48.m_object,0,0x20);
  GVar5 = glu::CallLogWrapper::glGetError(&local_c8);
  if (GVar5 != 0) {
    local_e8 = local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Got Error ","");
    local_a0 = glu::getErrorName;
    local_98 = GVar5;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_108,&local_a0);
    uVar9 = 0xf;
    if (local_e8 != local_d8) {
      uVar9 = local_d8[0];
    }
    if (uVar9 < local_108._M_string_length + local_e0) {
      uVar10 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        uVar10 = local_108.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar10 < local_108._M_string_length + local_e0) goto LAB_01577a13;
      plVar7 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_108,0,(char *)0x0,(ulong)local_e8);
    }
    else {
LAB_01577a13:
      plVar7 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_e8,(ulong)local_108._M_dataplus._M_p);
    }
    local_168.m_log = &local_158;
    pTVar3 = (TestLog *)(plVar7 + 2);
    if ((TestLog *)*plVar7 == pTVar3) {
      local_158.m_log = pTVar3->m_log;
      lStack_150 = plVar7[3];
    }
    else {
      local_158.m_log = pTVar3->m_log;
      local_168.m_log = (TestLog *)*plVar7;
    }
    local_160 = plVar7[1];
    *plVar7 = (long)pTVar3;
    plVar7[1] = 0;
    *(undefined1 *)&pTVar3->m_log = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_168);
    psVar8 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_128.field_2._M_allocated_capacity = *psVar8;
      local_128.field_2._8_8_ = plVar7[3];
      local_128._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_128.field_2._M_allocated_capacity = *psVar8;
      local_128._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_128._M_string_length = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_128);
    psVar8 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_148.field_2._M_allocated_capacity = *psVar8;
      local_148.field_2._8_8_ = plVar7[3];
      local_148._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_148.field_2._M_allocated_capacity = *psVar8;
      local_148._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_148._M_string_length = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    tcu::ResultCollector::fail(result,&local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != paVar2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != paVar1) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if (local_168.m_log != &local_158) {
      operator_delete(local_168.m_log,(ulong)((long)&(local_158.m_log)->flags + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if (local_e8 != local_d8) {
      operator_delete(local_e8,local_d8[0] + 1);
    }
  }
  glu::CallLogWrapper::glBindVertexArray(&local_c8,local_90.m_object);
  GVar5 = glu::CallLogWrapper::glGetError(&local_c8);
  if (GVar5 == 0) goto LAB_01577e02;
  local_e8 = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Got Error ","");
  local_a0 = glu::getErrorName;
  local_98 = GVar5;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_108,&local_a0);
  uVar9 = 0xf;
  if (local_e8 != local_d8) {
    uVar9 = local_d8[0];
  }
  if (uVar9 < local_108._M_string_length + local_e0) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      uVar10 = local_108.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar10 < local_108._M_string_length + local_e0) goto LAB_01577c68;
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_108,0,(char *)0x0,(ulong)local_e8);
  }
  else {
LAB_01577c68:
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_e8,(ulong)local_108._M_dataplus._M_p);
  }
  local_168.m_log = &local_158;
  pTVar3 = (TestLog *)(plVar7 + 2);
  if ((TestLog *)*plVar7 == pTVar3) {
    local_158.m_log = pTVar3->m_log;
    lStack_150 = plVar7[3];
  }
  else {
    local_158.m_log = pTVar3->m_log;
    local_168.m_log = (TestLog *)*plVar7;
  }
  local_160 = plVar7[1];
  *plVar7 = (long)pTVar3;
  plVar7[1] = 0;
  *(undefined1 *)&pTVar3->m_log = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_168);
  psVar8 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_128.field_2._M_allocated_capacity = *psVar8;
    local_128.field_2._8_8_ = plVar7[3];
    local_128._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_128.field_2._M_allocated_capacity = *psVar8;
    local_128._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_128._M_string_length = plVar7[1];
  *plVar7 = (long)psVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_128);
  psVar8 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_148.field_2._M_allocated_capacity = *psVar8;
    local_148.field_2._8_8_ = plVar7[3];
    local_148._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_148.field_2._M_allocated_capacity = *psVar8;
    local_148._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_148._M_string_length = plVar7[1];
  *plVar7 = (long)psVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  tcu::ResultCollector::fail(result,&local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != paVar2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar1) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if (local_168.m_log != &local_158) {
    operator_delete(local_168.m_log,(ulong)((long)&(local_158.m_log)->flags + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if (local_e8 != local_d8) {
    operator_delete(local_e8,local_d8[0] + 1);
  }
LAB_01577e02:
  deqp::gls::StateQueryUtil::verifyStateIndexedInteger
            (result,&local_c8,0x8f4f,1,local_60.m_object,(this->super_IndexedCase).m_verifier);
  glu::ObjectWrapper::~ObjectWrapper(&local_48);
  glu::ObjectWrapper::~ObjectWrapper(&local_78);
  tcu::TestLog::endSection(local_a8.m_log);
  pTVar3 = ((this->super_IndexedCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  local_148._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"autoUnbind","");
  local_128._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"Unbind on delete","");
  tcu::ScopedLogSection::ScopedLogSection(&local_168,pTVar3,&local_148,&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar1) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != paVar2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  iVar4 = (*((this->super_IndexedCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext
            [3])();
  pOVar6 = glu::objectTraits(OBJECTTYPE_VERTEX_ARRAY);
  glu::ObjectWrapper::ObjectWrapper
            ((ObjectWrapper *)&local_148,(Functions *)CONCAT44(extraout_var_04,iVar4),pOVar6);
  local_128._M_dataplus._M_p._0_4_ = 0xffffffff;
  glu::CallLogWrapper::glGenBuffers(&local_c8,1,(GLuint *)&local_128);
  glu::CallLogWrapper::glBindVertexBuffer(&local_c8,1,(GLuint)local_128._M_dataplus._M_p,0,0x20);
  glu::CallLogWrapper::glBindVertexArray(&local_c8,local_148.field_2._M_allocated_capacity._0_4_);
  glu::CallLogWrapper::glBindVertexBuffer(&local_c8,1,(GLuint)local_128._M_dataplus._M_p,0,0x20);
  glu::CallLogWrapper::glDeleteBuffers(&local_c8,1,(GLuint *)&local_128);
  deqp::gls::StateQueryUtil::verifyStateIndexedInteger
            (result,&local_c8,0x8f4f,1,0,(this->super_IndexedCase).m_verifier);
  glu::CallLogWrapper::glBindVertexArray(&local_c8,local_90.m_object);
  deqp::gls::StateQueryUtil::verifyStateIndexedInteger
            (result,&local_c8,0x8f4f,1,(GLuint)local_128._M_dataplus._M_p,
             (this->super_IndexedCase).m_verifier);
  glu::ObjectWrapper::~ObjectWrapper((ObjectWrapper *)&local_148);
  tcu::TestLog::endSection(local_168.m_log);
  glu::ObjectWrapper::~ObjectWrapper(&local_60);
  glu::ObjectWrapper::~ObjectWrapper(&local_90);
  glu::CallLogWrapper::~CallLogWrapper(&local_c8);
  return;
}

Assistant:

void VertexBindingBufferCase::test (tcu::ResultCollector& result)
{
	glu::CallLogWrapper gl					(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	glu::VertexArray	vao					(m_context.getRenderContext());
	glu::Buffer			buffer				(m_context.getRenderContext());
	glw::GLint			reportedMaxBindings	= -1;
	glw::GLint			maxBindings;

	gl.enableLogging(true);

	gl.glBindVertexArray(*vao);
	gl.glGetIntegerv(GL_MAX_VERTEX_ATTRIB_BINDINGS, &reportedMaxBindings);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGetIntegerv");

	maxBindings = de::max(16, reportedMaxBindings);

	// initial
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "initial", "Initial values");

		for (int binding = 0; binding < maxBindings; ++binding)
			verifyStateIndexedInteger(result, gl, GL_VERTEX_BINDING_BUFFER, binding, 0, m_verifier);
	}

	// is part of vao
	{
		const tcu::ScopedLogSection section			(m_testCtx.getLog(), "vao", "VAO state");
		glu::VertexArray			otherVao		(m_context.getRenderContext());
		glu::Buffer					otherBuffer		(m_context.getRenderContext());

		// set to value A in vao1
		gl.glBindVertexBuffer(1, *buffer, 0, 32);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindVertexBuffer");

		// set to value B in vao2
		gl.glBindVertexArray(*otherVao);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindVertexArray");
		gl.glBindVertexBuffer(1, *otherBuffer, 0, 32);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindVertexBuffer");

		// check value is still ok in original vao
		gl.glBindVertexArray(*vao);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindVertexArray");

		verifyStateIndexedInteger(result, gl, GL_VERTEX_BINDING_BUFFER, 1, *buffer, m_verifier);
	}

	// Is detached in delete from active vao and not from deactive
	{
		const tcu::ScopedLogSection section			(m_testCtx.getLog(), "autoUnbind", "Unbind on delete");
		glu::VertexArray			otherVao		(m_context.getRenderContext());
		glw::GLuint					otherBuffer		= -1;

		gl.glGenBuffers(1, &otherBuffer);

		// set in vao1 and vao2
		gl.glBindVertexBuffer(1, otherBuffer, 0, 32);
		gl.glBindVertexArray(*otherVao);
		gl.glBindVertexBuffer(1, otherBuffer, 0, 32);

		// delete buffer. This unbinds it from active (vao2) but not from unactive
		gl.glDeleteBuffers(1, &otherBuffer);
		verifyStateIndexedInteger(result, gl, GL_VERTEX_BINDING_BUFFER, 1, 0, m_verifier);

		gl.glBindVertexArray(*vao);
		verifyStateIndexedInteger(result, gl, GL_VERTEX_BINDING_BUFFER, 1, otherBuffer, m_verifier);
	}
}